

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_8x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i row;
  __m128i l16;
  int i;
  __m128i rep;
  __m128i l;
  int j;
  __m128i one;
  __m128i tl16;
  __m128i t16;
  __m128i zero;
  __m128i t;
  __m128i local_218;
  int local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined1 local_1a8;
  undefined1 uStack_1a7;
  undefined1 uStack_1a6;
  undefined1 uStack_1a5;
  undefined1 uStack_1a4;
  undefined1 uStack_1a3;
  undefined1 uStack_1a2;
  undefined1 uStack_1a1;
  undefined1 uStack_1a0;
  undefined1 uStack_19f;
  undefined1 uStack_19e;
  undefined1 uStack_19d;
  undefined1 uStack_19c;
  undefined1 uStack_19b;
  undefined1 uStack_19a;
  undefined1 uStack_199;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  long local_178;
  long local_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined2 local_fe;
  undefined2 local_fc;
  ushort local_fa;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  undefined8 *local_70;
  ulong local_68;
  ulong uStack_60;
  ushort local_58;
  ushort local_56;
  ushort local_54;
  ushort local_52;
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_188 = *in_RDX;
  uStack_150 = 0;
  uStack_180 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_118._0_1_ = (undefined1)local_188;
  local_118._1_1_ = (undefined1)((ulong)local_188 >> 8);
  local_118._2_1_ = (undefined1)((ulong)local_188 >> 0x10);
  local_118._3_1_ = (undefined1)((ulong)local_188 >> 0x18);
  local_118._4_1_ = (undefined1)((ulong)local_188 >> 0x20);
  local_118._5_1_ = (undefined1)((ulong)local_188 >> 0x28);
  local_118._6_1_ = (undefined1)((ulong)local_188 >> 0x30);
  local_118._7_1_ = (undefined1)((ulong)local_188 >> 0x38);
  local_1a8 = (undefined1)local_118;
  uStack_1a7 = 0;
  uStack_1a6 = local_118._1_1_;
  uStack_1a5 = 0;
  uStack_1a4 = local_118._2_1_;
  uStack_1a3 = 0;
  uStack_1a2 = local_118._3_1_;
  uStack_1a1 = 0;
  uStack_1a0 = local_118._4_1_;
  uStack_19f = 0;
  uStack_19e = local_118._5_1_;
  uStack_19d = 0;
  uStack_19c = local_118._6_1_;
  uStack_19b = 0;
  uStack_19a = local_118._7_1_;
  uStack_199 = 0;
  bVar1 = *(byte *)((long)in_RDX + -1);
  local_fa = (ushort)bVar1;
  local_1b8 = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,local_fa)));
  uStack_1b0 = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,local_fa)));
  local_fc = 1;
  local_2a = 1;
  local_2c = 1;
  local_2e = 1;
  local_30 = 1;
  local_32 = 1;
  local_34 = 1;
  local_36 = 1;
  local_38 = 1;
  local_1c8 = 0x1000100010001;
  uStack_1c0 = 0x1000100010001;
  local_178 = in_RCX;
  local_168 = in_RSI;
  local_160 = in_RDI;
  local_158 = local_188;
  local_118 = local_188;
  local_68 = local_1b8;
  uStack_60 = uStack_1b0;
  local_58 = local_fa;
  local_56 = local_fa;
  local_54 = local_fa;
  local_52 = local_fa;
  local_50 = local_fa;
  local_4e = local_fa;
  local_4c = local_fa;
  local_4a = local_fa;
  local_48 = local_1c8;
  uStack_40 = uStack_1c0;
  for (local_1cc = 0; local_1cc < 2; local_1cc = local_1cc + 1) {
    local_90 = (undefined8 *)(local_178 + (local_1cc << 4));
    local_1e8 = *local_90;
    uStack_1e0 = local_90[1];
    local_fe = 0x8000;
    local_2 = 0x8000;
    local_4 = 0x8000;
    local_6 = 0x8000;
    local_8 = 0x8000;
    local_a = 0x8000;
    local_c = 0x8000;
    local_e = 0x8000;
    local_10 = 0x8000;
    local_1f8 = 0x8000800080008000;
    uStack_1f0 = 0x8000800080008000;
    local_28 = local_1f8;
    uStack_20 = uStack_1f0;
    for (local_1fc = 0; local_1fc < 0x10; local_1fc = local_1fc + 1) {
      local_e8 = local_1e8;
      uStack_e0 = uStack_1e0;
      local_f8 = local_1f8;
      uStack_f0 = uStack_1f0;
      auVar11._8_8_ = uStack_1e0;
      auVar11._0_8_ = local_1e8;
      auVar10._8_8_ = uStack_1f0;
      auVar10._0_8_ = local_1f8;
      local_218 = (__m128i)pshufb(auVar11,auVar10);
      paeth_8x1_pred(&local_218,(__m128i *)&local_1a8,(__m128i *)&local_1b8);
      local_70 = local_160;
      local_c8 = (short)extraout_XMM0_Qa;
      sStack_c6 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      sStack_c4 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      sStack_c2 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      sStack_c0 = (short)extraout_XMM0_Qb;
      sStack_be = (short)((ulong)extraout_XMM0_Qb >> 0x10);
      sStack_bc = (short)((ulong)extraout_XMM0_Qb >> 0x20);
      sStack_ba = (short)((ulong)extraout_XMM0_Qb >> 0x30);
      local_88 = (0 < local_c8) * (local_c8 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_c8);
      cVar2 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
      cStack_87 = (0 < sStack_c6) * (sStack_c6 < 0x100) * cVar2 - (0xff < sStack_c6);
      cVar3 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
      cStack_86 = (0 < sStack_c4) * (sStack_c4 < 0x100) * cVar3 - (0xff < sStack_c4);
      cVar4 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
      cStack_85 = (0 < sStack_c2) * (sStack_c2 < 0x100) * cVar4 - (0xff < sStack_c2);
      cStack_84 = (0 < sStack_c0) * (sStack_c0 < 0x100) * (char)extraout_XMM0_Qb -
                  (0xff < sStack_c0);
      cVar5 = (char)((ulong)extraout_XMM0_Qb >> 0x10);
      cStack_83 = (0 < sStack_be) * (sStack_be < 0x100) * cVar5 - (0xff < sStack_be);
      cVar6 = (char)((ulong)extraout_XMM0_Qb >> 0x20);
      cStack_82 = (0 < sStack_bc) * (sStack_bc < 0x100) * cVar6 - (0xff < sStack_bc);
      cVar7 = (char)((ulong)extraout_XMM0_Qb >> 0x30);
      cStack_81 = (0 < sStack_ba) * (sStack_ba < 0x100) * cVar7 - (0xff < sStack_ba);
      cStack_80 = (0 < local_c8) * (local_c8 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_c8);
      cStack_7f = (0 < sStack_c6) * (sStack_c6 < 0x100) * cVar2 - (0xff < sStack_c6);
      cStack_7e = (0 < sStack_c4) * (sStack_c4 < 0x100) * cVar3 - (0xff < sStack_c4);
      cStack_7d = (0 < sStack_c2) * (sStack_c2 < 0x100) * cVar4 - (0xff < sStack_c2);
      cStack_7c = (0 < sStack_c0) * (sStack_c0 < 0x100) * (char)extraout_XMM0_Qb -
                  (0xff < sStack_c0);
      cStack_7b = (0 < sStack_be) * (sStack_be < 0x100) * cVar5 - (0xff < sStack_be);
      cStack_7a = (0 < sStack_bc) * (sStack_bc < 0x100) * cVar6 - (0xff < sStack_bc);
      cStack_79 = (0 < sStack_ba) * (sStack_ba < 0x100) * cVar7 - (0xff < sStack_ba);
      *local_160 = CONCAT17(cStack_81,
                            CONCAT16(cStack_82,
                                     CONCAT15(cStack_83,
                                              CONCAT14(cStack_84,
                                                       CONCAT13(cStack_85,
                                                                CONCAT12(cStack_86,
                                                                         CONCAT11(cStack_87,local_88
                                                                                 )))))));
      local_160 = (undefined8 *)(local_168 + (long)local_160);
      uVar8 = local_1f8;
      uVar9 = uStack_1f0;
      local_a8._0_2_ = (short)local_1f8;
      local_a8._2_2_ = (short)((ulong)local_1f8 >> 0x10);
      local_a8._4_2_ = (short)((ulong)local_1f8 >> 0x20);
      local_a8._6_2_ = (short)((ulong)local_1f8 >> 0x30);
      uStack_a0._0_2_ = (short)uStack_1f0;
      uStack_a0._2_2_ = (short)((ulong)uStack_1f0 >> 0x10);
      uStack_a0._4_2_ = (short)((ulong)uStack_1f0 >> 0x20);
      uStack_a0._6_2_ = (short)((ulong)uStack_1f0 >> 0x30);
      local_b8._0_2_ = (short)local_1c8;
      local_b8._2_2_ = (short)((ulong)local_1c8 >> 0x10);
      local_b8._4_2_ = (short)((ulong)local_1c8 >> 0x20);
      local_b8._6_2_ = (short)((ulong)local_1c8 >> 0x30);
      uStack_b0._0_2_ = (short)uStack_1c0;
      uStack_b0._2_2_ = (short)((ulong)uStack_1c0 >> 0x10);
      uStack_b0._4_2_ = (short)((ulong)uStack_1c0 >> 0x20);
      uStack_b0._6_2_ = (short)((ulong)uStack_1c0 >> 0x30);
      local_1f8 = CONCAT26(local_a8._6_2_ + local_b8._6_2_,
                           CONCAT24(local_a8._4_2_ + local_b8._4_2_,
                                    CONCAT22(local_a8._2_2_ + local_b8._2_2_,
                                             (short)local_a8 + (short)local_b8)));
      uStack_1f0 = CONCAT26(uStack_a0._6_2_ + uStack_b0._6_2_,
                            CONCAT24(uStack_a0._4_2_ + uStack_b0._4_2_,
                                     CONCAT22(uStack_a0._2_2_ + uStack_b0._2_2_,
                                              (short)uStack_a0 + (short)uStack_b0)));
      local_b8 = local_1c8;
      uStack_b0 = uStack_1c0;
      local_a8 = uVar8;
      uStack_a0 = uVar9;
    }
  }
  return;
}

Assistant:

void aom_paeth_predictor_8x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m128i t = _mm_loadl_epi64((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);

  for (int j = 0; j < 2; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (int i = 0; i < 16; ++i) {
      const __m128i l16 = _mm_shuffle_epi8(l, rep);
      const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

      _mm_storel_epi64((__m128i *)dst, _mm_packus_epi16(row, row));
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}